

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O2

int google::protobuf::internal::WireFormat::ByteSize(Message *message)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  UnknownFieldSet *pUVar5;
  int i;
  ulong uVar6;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_48;
  long *plVar4;
  
  iVar1 = (*(message->super_MessageLite)._vptr_MessageLite[0x13])();
  iVar2 = (*(message->super_MessageLite)._vptr_MessageLite[0x12])(message);
  plVar4 = (long *)CONCAT44(extraout_var_00,iVar2);
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (**(code **)(*plVar4 + 0x60))(plVar4,message);
  iVar2 = 0;
  for (uVar6 = 0;
      uVar6 < (ulong)((long)local_48._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_48._M_impl.super__Vector_impl_data._M_start >> 3);
      uVar6 = uVar6 + 1) {
    iVar3 = FieldByteSize(local_48._M_impl.super__Vector_impl_data._M_start[uVar6],message);
    iVar2 = iVar2 + iVar3;
  }
  if (*(char *)(*(long *)(CONCAT44(extraout_var,iVar1) + 0x20) + 0x58) == '\0') {
    pUVar5 = (UnknownFieldSet *)(**(code **)(*plVar4 + 0x10))(plVar4,message);
    iVar1 = ComputeUnknownFieldsSize(pUVar5);
  }
  else {
    pUVar5 = (UnknownFieldSet *)(**(code **)(*plVar4 + 0x10))(plVar4,message);
    iVar1 = ComputeUnknownMessageSetItemsSize(pUVar5);
  }
  std::
  _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~_Vector_base(&local_48);
  return iVar1 + iVar2;
}

Assistant:

int WireFormat::ByteSize(const Message& message) {
  const Descriptor* descriptor = message.GetDescriptor();
  const Reflection* message_reflection = message.GetReflection();

  int our_size = 0;

  vector<const FieldDescriptor*> fields;
  message_reflection->ListFields(message, &fields);
  for (int i = 0; i < fields.size(); i++) {
    our_size += FieldByteSize(fields[i], message);
  }

  if (descriptor->options().message_set_wire_format()) {
    our_size += ComputeUnknownMessageSetItemsSize(
      message_reflection->GetUnknownFields(message));
  } else {
    our_size += ComputeUnknownFieldsSize(
      message_reflection->GetUnknownFields(message));
  }

  return our_size;
}